

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

quaternion *
quaternion_cross_product_EXP(quaternion *__return_storage_ptr__,quaternion *self,quaternion *vT)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = (vT->field_0).q[1];
  dVar2 = (vT->field_0).q[2];
  dVar3 = (self->field_0).q[1];
  dVar4 = (self->field_0).q[2];
  (__return_storage_ptr__->field_0).q[0] = dVar3 * dVar2 - dVar1 * dVar4;
  dVar5 = (vT->field_0).q[0];
  dVar6 = (self->field_0).q[0];
  (__return_storage_ptr__->field_0).q[1] = dVar4 * dVar5 - dVar2 * dVar6;
  (__return_storage_ptr__->field_0).q[2] = dVar6 * dVar1 - dVar5 * dVar3;
  (__return_storage_ptr__->field_0).q[3] = -(dVar4 * dVar2 + dVar6 * dVar5 + dVar3 * dVar1);
  return __return_storage_ptr__;
}

Assistant:

HYPAPI struct quaternion quaternion_cross_product_EXP(const struct quaternion *self, const struct quaternion *vT)
{
	/*
	 * The code is suspect (missing w element in this whole thing)
	 * It is computing a cross-product on the vector portion and a
	 * negative dot product on the real portion.
	 */
	struct quaternion r;

	r.x = (self->y * vT->z) - (self->z * vT->y);
	r.y = (self->z * vT->x) - (self->x * vT->z);
	r.z = (self->x * vT->y) - (self->y * vT->x);
	r.w = -((self->x * vT->x) + (self->y * vT->y) + (self->z * vT->z));

	return r;
}